

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

pair<trieste::NodeDef_*,_trieste::NodeDef_*> __thiscall
trieste::NodeDef::same_parent(NodeDef *this,NodeDef *q)

{
  NodeDef **ppNVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  NodeDef *t;
  NodeDef *pNVar5;
  int iVar6;
  NodeDef *p;
  NodeDef *pNVar7;
  pair<trieste::NodeDef_*,_trieste::NodeDef_*> pVar8;
  
  uVar2 = 0;
  pNVar5 = this;
  do {
    pNVar5 = pNVar5->parent_;
    uVar2 = uVar2 - 1;
  } while (pNVar5 != (NodeDef *)0x0);
  iVar4 = 0;
  pNVar5 = q;
  if (q != (NodeDef *)0x0) {
    do {
      iVar4 = iVar4 + 1;
      ppNVar1 = &pNVar5->parent_;
      pNVar5 = *ppNVar1;
    } while (*ppNVar1 != (NodeDef *)0x0);
  }
  iVar3 = -uVar2;
  iVar6 = iVar4;
  if (iVar4 <= (int)~uVar2) {
    do {
      this = this->parent_;
      iVar6 = iVar6 + 1;
    } while (iVar3 != iVar6);
  }
  if (iVar4 != iVar3 && SBORROW4(iVar4,iVar3) == (int)(iVar4 + uVar2) < 0) {
    do {
      q = q->parent_;
      iVar4 = iVar4 + -1;
    } while (iVar3 != iVar4);
  }
  do {
    pNVar7 = this;
    pNVar5 = q;
    this = pNVar7->parent_;
    q = pNVar5->parent_;
  } while (this != q);
  pVar8.second = pNVar5;
  pVar8.first = pNVar7;
  return pVar8;
}

Assistant:

std::pair<NodeDef*, NodeDef*> same_parent(NodeDef* q)
    {
      auto p = this;

      // Adjust p and q to point to the same depth in the AST.
      int d1 = 0, d2 = 0;

      for (auto t = p; t; t = t->parent_)
        ++d1;
      for (auto t = q; t; t = t->parent_)
        ++d2;

      for (int i = 0; i < (d1 - d2); ++i)
        p = p->parent_;
      for (int i = 0; i < (d2 - d1); ++i)
        q = q->parent_;

      // Find the common parent.
      while (p->parent_ != q->parent_)
      {
        p = p->parent_;
        q = q->parent_;
      }

      return {p, q};
    }